

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

Totals * __thiscall Catch::Runner2::runTests(Totals *__return_storage_ptr__,Runner2 *this)

{
  Ptr<Catch::IReporter> *reporter;
  IReporter *pIVar1;
  pointer filterGroup;
  vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_> filterGroups;
  Runner context;
  allocator<char> local_231;
  Runner2 *local_230;
  vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_> local_228;
  string local_210;
  Runner local_1f0;
  
  std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>::vector
            (&local_228,&this->m_config->filters);
  if (local_228.super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      local_228.super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_210,"",&local_231);
    TestCaseFilters::TestCaseFilters((TestCaseFilters *)&local_1f0,&local_210);
    std::__cxx11::string::~string((string *)&local_210);
    std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>::push_back
              (&local_228,(value_type *)&local_1f0);
    TestCaseFilters::~TestCaseFilters((TestCaseFilters *)&local_1f0);
  }
  reporter = &this->m_reporter;
  local_230 = this;
  Runner::Runner(&local_1f0,this->m_configWrapper,reporter);
  (__return_storage_ptr__->testCases).passed = 0;
  (__return_storage_ptr__->testCases).failed = 0;
  (__return_storage_ptr__->assertions).passed = 0;
  (__return_storage_ptr__->assertions).failed = 0;
  filterGroup = local_228.
                super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>.
                _M_impl.super__Vector_impl_data._M_start;
  while ((filterGroup !=
          local_228.
          super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>.
          _M_impl.super__Vector_impl_data._M_finish &&
         (local_1f0.m_totals.assertions.failed != (long)((local_1f0.m_config)->m_data).cutoff))) {
    pIVar1 = reporter->m_p;
    std::__cxx11::string::string((string *)&local_210,(string *)&filterGroup->m_name);
    (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[7])(pIVar1,&local_210);
    std::__cxx11::string::~string((string *)&local_210);
    runTestsForGroup((Totals *)&local_210,local_230,&local_1f0,filterGroup);
    Totals::operator+=(__return_storage_ptr__,(Totals *)&local_210);
    if (local_1f0.m_totals.assertions.failed == (long)((local_1f0.m_config)->m_data).cutoff) {
      (*(reporter->m_p->super_IShared).super_NonCopyable._vptr_NonCopyable[0xf])();
    }
    pIVar1 = reporter->m_p;
    std::__cxx11::string::string((string *)&local_210,(string *)&filterGroup->m_name);
    (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[8])
              (pIVar1,&local_210,__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_210);
    filterGroup = filterGroup + 1;
  }
  Runner::~Runner(&local_1f0);
  std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>::~vector(&local_228);
  return __return_storage_ptr__;
}

Assistant:

Totals runTests() {

            std::vector<TestCaseFilters> filterGroups = m_config.filters;
            if( filterGroups.empty() ) {
                TestCaseFilters filterGroup( "" );
                filterGroups.push_back( filterGroup );
            }

            Runner context( m_configWrapper, m_reporter ); // This Runner will be renamed Context
            Totals totals;

            std::vector<TestCaseFilters>::const_iterator it = filterGroups.begin();
            std::vector<TestCaseFilters>::const_iterator itEnd = filterGroups.end();
            for(; it != itEnd && !context.aborting(); ++it ) {
                m_reporter->StartGroup( it->getName() );
                totals += runTestsForGroup( context, *it );
                if( context.aborting() )
                    m_reporter->Aborted();
                m_reporter->EndGroup( it->getName(), totals );
            }
            return totals;
        }